

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# katajainen.c
# Opt level: O2

int ZopfliLengthLimitedCodeLengths(size_t *frequencies,int n,int maxbits,uint *bitlengths)

{
  ulong *puVar1;
  byte bVar2;
  int iVar3;
  Node *leaves;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  Node *pNVar7;
  Node *(*lists) [2];
  NodePool NVar8;
  ulong uVar9;
  uint uVar10;
  size_t __nmemb;
  int *piVar11;
  int index;
  uint uVar12;
  int iVar13;
  bool bVar14;
  NodePool local_88;
  Node *local_80;
  int local_78 [14];
  ulong uStack_40;
  
  leaves = (Node *)malloc((long)n * 0x18);
  uVar4 = 0;
  uVar5 = (ulong)(uint)n;
  if (n < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    bitlengths[uVar4] = 0;
  }
  uVar10 = 0;
  for (uVar4 = 0; __nmemb = (size_t)(int)uVar10, uVar5 != uVar4; uVar4 = uVar4 + 1) {
    if (frequencies[uVar4] != 0) {
      leaves[__nmemb].weight = frequencies[uVar4];
      leaves[__nmemb].count = (int)uVar4;
      uVar10 = uVar10 + 1;
    }
  }
  bVar2 = (byte)maxbits & 0x1f;
  iVar3 = 1;
  if (1 << bVar2 < (int)uVar10) {
LAB_001234c2:
    free(leaves);
  }
  else {
    if (uVar10 != 0) {
      if (uVar10 == 1) {
        bitlengths[leaves->count] = 1;
      }
      else if (uVar10 == 2) {
        bitlengths[leaves->count] = bitlengths[leaves->count] + 1;
        bitlengths[leaves[1].count] = bitlengths[leaves[1].count] + 1;
      }
      else {
        uVar5 = (ulong)(uint)(0 << bVar2);
        uVar4 = 0;
        if (0 < (int)uVar10) {
          uVar4 = (ulong)uVar10;
        }
        for (; uVar4 * 0x18 - uVar5 != 0; uVar5 = uVar5 + 0x18) {
          uVar9 = *(ulong *)((long)&leaves->weight + uVar5);
          if (uVar9 >> 0x37 != 0) goto LAB_001234c2;
          *(ulong *)((long)&leaves->weight + uVar5) =
               (long)*(int *)((long)&leaves->count + uVar5) | uVar9 << 9;
        }
        qsort(leaves,__nmemb,0x18,LeafComparator);
        for (lVar6 = 0; uVar4 * 0x18 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
          puVar1 = (ulong *)((long)&leaves->weight + lVar6);
          *puVar1 = *puVar1 >> 9;
        }
        uVar12 = uVar10 - 1;
        if (maxbits < (int)uVar10) {
          uVar12 = maxbits;
        }
        iVar3 = uVar10 * 2;
        pNVar7 = (Node *)malloc((long)(int)(iVar3 * uVar12) * 0x18);
        lists = (Node *(*) [2])malloc((long)(int)uVar12 << 4);
        pNVar7->weight = leaves->weight;
        pNVar7->count = 1;
        pNVar7->tail = (Node *)0x0;
        pNVar7[1].weight = leaves[1].weight;
        pNVar7[1].count = 2;
        pNVar7[1].tail = (Node *)0x0;
        local_88.next = pNVar7 + 2;
        lVar6 = 0;
        uVar5 = 0;
        if (0 < (int)uVar12) {
          uVar5 = (ulong)uVar12;
        }
        for (; uVar5 * 0x10 != lVar6; lVar6 = lVar6 + 0x10) {
          *(Node **)((long)*lists + lVar6) = pNVar7;
          *(Node **)((long)*lists + lVar6 + 8) = pNVar7 + 1;
        }
        index = uVar12 - 1;
        iVar13 = 5;
        if (5 < iVar3) {
          iVar13 = iVar3;
        }
        iVar13 = iVar13 + -5;
        local_80 = pNVar7;
        while (bVar14 = iVar13 != 0, iVar13 = iVar13 + -1, bVar14) {
          BoundaryPM(lists,leaves,uVar10,&local_88,index);
        }
        pNVar7 = lists[(long)index + -1][1];
        NVar8.next = lists[index][1];
        iVar3 = (NVar8.next)->count;
        if ((iVar3 < (int)uVar10) &&
           (leaves[iVar3].weight < pNVar7->weight + lists[(long)index + -1][0]->weight)) {
          pNVar7 = (NVar8.next)->tail;
          lists[index][1] = local_88.next;
          (local_88.next)->count = iVar3 + 1;
          NVar8.next = local_88.next;
        }
        (NVar8.next)->tail = pNVar7;
        local_78[0xc] = 0;
        local_78[0xd] = 0;
        uStack_40 = 0;
        local_78[8] = 0;
        local_78[9] = 0;
        local_78[10] = 0;
        local_78[0xb] = 0;
        local_78[4] = 0;
        local_78[5] = 0;
        local_78[6] = 0;
        local_78[7] = 0;
        local_78[0] = 0;
        local_78[1] = 0;
        local_78[2] = 0;
        local_78[3] = 0;
        uVar5 = 0x10;
        for (; NVar8.next != (Node *)0x0; NVar8.next = (NVar8.next)->tail) {
          uVar5 = (ulong)((int)uVar5 - 1);
          local_78[uVar5] = (NVar8.next)->count;
        }
        uVar9 = uStack_40 >> 0x20;
        uVar10 = 1;
        uVar4 = 0xf;
        while (uVar5 <= uVar4) {
          uVar4 = uVar4 - 1;
          iVar3 = local_78[uVar4 & 0xffffffff];
          uVar9 = (ulong)(int)uVar9;
          piVar11 = &leaves[uVar9 - 1].count;
          for (; (long)iVar3 < (long)uVar9; uVar9 = uVar9 - 1) {
            bitlengths[*piVar11] = uVar10;
            piVar11 = piVar11 + -6;
          }
          uVar10 = uVar10 + 1;
        }
        free(lists);
        free(leaves);
        leaves = local_80;
      }
    }
    free(leaves);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int ZopfliLengthLimitedCodeLengths(
    const size_t* frequencies, int n, int maxbits, unsigned* bitlengths) {
  NodePool pool;
  int i;
  int numsymbols = 0;  /* Amount of symbols with frequency > 0. */
  int numBoundaryPMRuns;
  Node* nodes;

  /* Array of lists of chains. Each list requires only two lookahead chains at
  a time, so each list is a array of two Node*'s. */
  Node* (*lists)[2];

  /* One leaf per symbol. Only numsymbols leaves will be used. */
  Node* leaves = (Node*)malloc(n * sizeof(*leaves));

  /* Initialize all bitlengths at 0. */
  for (i = 0; i < n; i++) {
    bitlengths[i] = 0;
  }

  /* Count used symbols and place them in the leaves. */
  for (i = 0; i < n; i++) {
    if (frequencies[i]) {
      leaves[numsymbols].weight = frequencies[i];
      leaves[numsymbols].count = i;  /* Index of symbol this leaf represents. */
      numsymbols++;
    }
  }

  /* Check special cases and error conditions. */
  if ((1 << maxbits) < numsymbols) {
    free(leaves);
    return 1;  /* Error, too few maxbits to represent symbols. */
  }
  if (numsymbols == 0) {
    free(leaves);
    return 0;  /* No symbols at all. OK. */
  }
  if (numsymbols == 1) {
    bitlengths[leaves[0].count] = 1;
    free(leaves);
    return 0;  /* Only one symbol, give it bitlength 1, not 0. OK. */
  }
  if (numsymbols == 2) {
    bitlengths[leaves[0].count]++;
    bitlengths[leaves[1].count]++;
    free(leaves);
    return 0;
  }

  /* Sort the leaves from lightest to heaviest. Add count into the same
  variable for stable sorting. */
  for (i = 0; i < numsymbols; i++) {
    if (leaves[i].weight >=
        ((size_t)1 << (sizeof(leaves[0].weight) * CHAR_BIT - 9))) {
      free(leaves);
      return 1;  /* Error, we need 9 bits for the count. */
    }
    leaves[i].weight = (leaves[i].weight << 9) | leaves[i].count;
  }
  qsort(leaves, numsymbols, sizeof(Node), LeafComparator);
  for (i = 0; i < numsymbols; i++) {
    leaves[i].weight >>= 9;
  }

  if (numsymbols - 1 < maxbits) {
    maxbits = numsymbols - 1;
  }

  /* Initialize node memory pool. */
  nodes = (Node*)malloc(maxbits * 2 * numsymbols * sizeof(Node));
  pool.next = nodes;

  lists = (Node* (*)[2])malloc(maxbits * sizeof(*lists));
  InitLists(&pool, leaves, maxbits, lists);

  /* In the last list, 2 * numsymbols - 2 active chains need to be created. Two
  are already created in the initialization. Each BoundaryPM run creates one. */
  numBoundaryPMRuns = 2 * numsymbols - 4;
  for (i = 0; i < numBoundaryPMRuns - 1; i++) {
    BoundaryPM(lists, leaves, numsymbols, &pool, maxbits - 1);
  }
  BoundaryPMFinal(lists, leaves, numsymbols, &pool, maxbits - 1);

  ExtractBitLengths(lists[maxbits - 1][1], leaves, bitlengths);

  free(lists);
  free(leaves);
  free(nodes);
  return 0;  /* OK. */
}